

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O1

int __thiscall MemTable::remove(MemTable *this,char *__filename)

{
  time_t tVar1;
  char *pcVar2;
  QuadListNode<SSTableDataEntry> *pred_node;
  Result RVar3;
  string local_50;
  
  RVar3 = skipSearch(this,(this->qlist).
                          super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next,(longlong)__filename);
  pred_node = RVar3.node;
  tVar1 = time((time_t *)0x0);
  if (((undefined1  [16])RVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    _put(this,pred_node,(longlong)__filename,&local_50,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar2 = (char *)(pred_node->data).key;
  if (pcVar2 == __filename) {
    if ((pred_node->data).delete_flag == false) {
      this->_size_bytes = (this->_size_bytes - (pred_node->data).value._M_string_length) - 0x19;
      std::__cxx11::string::_M_replace
                ((ulong)&(pred_node->data).value,0,(char *)(pred_node->data).value._M_string_length,
                 0x10b00e);
      (pred_node->data).timestamp = tVar1;
      (pred_node->data).value_length = 0;
      pcVar2 = (char *)((pred_node->data).value._M_string_length + this->_size_bytes + 0x19);
      this->_size_bytes = (size_t)pcVar2;
      do {
        (pred_node->data).delete_flag = true;
        pred_node = pred_node->above;
      } while (pred_node != (QuadListNode<SSTableDataEntry> *)0x0);
    }
    else if ((pcVar2 == __filename) && ((pred_node->data).delete_flag == true)) {
      (pred_node->data).timestamp = tVar1;
    }
  }
  return (int)CONCAT71((int7)((ulong)pcVar2 >> 8),1);
}

Assistant:

bool MemTable::remove(long long k) {
    auto[valid, to_delete] = skipSearch(qlist.begin(), k);
    auto timestamp = time(nullptr);
    if (!valid) {
        // k not found, as MemTable of a LSMTree, insert new tower marked as deleted.
        _put(to_delete, k, "", true);
    }
    if (to_delete->data.key == k && !to_delete->data.delete_flag) {
        // found k and has not been marked as deleted. mark deleted, remove value, update timestamp.
        _size_bytes -= size_of_node(to_delete);
        to_delete->data.value = "";
        to_delete->data.timestamp = timestamp;
        to_delete->data.value_length = 0;
        _size_bytes += size_of_node(to_delete);
        do {
            to_delete->data.delete_flag = true;
            to_delete = to_delete->above;
        } while (to_delete != nullptr);
        return true;
    }
    if (to_delete->data.key == k && to_delete->data.delete_flag) {
        // found k and its has been marked as deleted, just update timestamp.
        to_delete->data.timestamp = timestamp; // bytes level size don't change.
    }
    return true;
}